

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_LineEffect
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  int val;
  AActor *activator;
  maplinedef_t oldjunk;
  line_t_conflict junk;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003eab16;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003eab06:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003eab16:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x149b,
                  "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  activator = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (activator == (AActor *)0x0) goto LAB_003ea9f9;
    bVar2 = DObject::IsKindOf((DObject *)activator,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003eab16;
    }
  }
  else {
    if (activator != (AActor *)0x0) goto LAB_003eab06;
LAB_003ea9f9:
    activator = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eab7c:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x149c,
                    "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    sVar3 = (short)param[1].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eab7c;
    }
    sVar3 = (short)param[1].field_0.i;
    if (2 < (uint)numparam) {
      if (param[2].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003eab35;
      }
      goto LAB_003eaa4e;
    }
    param = defaultparam->Array;
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eab35:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x149d,
                  "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003eaa4e:
  iVar6 = 0;
  val = 0;
  if (((activator->flags6).Value & 0x8000) == 0) {
    val = 0;
    oldjunk.special = sVar3;
    if (sVar3 != 0) {
      oldjunk.tag = (short)param[2].field_0.i;
      P_TranslateLineDef((line_t *)&junk,&oldjunk,-1);
      val = 0;
      iVar4 = P_ExecuteSpecial(junk.special,(line_t *)0x0,activator,false,junk.args[0],junk.args[1],
                               junk.args[2],junk.args[3],junk.args[4]);
      if (iVar4 != 0) {
        val = 1;
        if ((junk.flags._1_1_ & 2) == 0) {
          pbVar1 = (byte *)((long)&(activator->flags6).Value + 1);
          *pbVar1 = *pbVar1 | 0x80;
        }
      }
    }
  }
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14ae,
                    "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = 1;
    VMReturn::SetInt(ret,val);
  }
  return iVar6;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LineEffect)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(special);
	PARAM_INT_DEF(tag);

	line_t junk;
	maplinedef_t oldjunk;
	bool res = false;
	if (!(self->flags6 & MF6_LINEDONE))						// Unless already used up
	{
		if ((oldjunk.special = special))					// Linedef type
		{
			oldjunk.tag = tag;								// Sector tag for linedef
			P_TranslateLineDef(&junk, &oldjunk);			// Turn into native type
			res = !!P_ExecuteSpecial(junk.special, NULL, self, false, junk.args[0], 
				junk.args[1], junk.args[2], junk.args[3], junk.args[4]); 
			if (res && !(junk.flags & ML_REPEAT_SPECIAL))	// If only once,
				self->flags6 |= MF6_LINEDONE;				// no more for this thing
		}
	}
	ACTION_RETURN_BOOL(res);
}